

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayLocatorMethod::checkArguments
          (ArrayLocatorMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  SourceLocation this_00;
  Type *pTVar2;
  ASTContext *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  ASTContext *in_RDI;
  SystemSubroutine *in_R8;
  SourceLocation in_R9;
  Type *indexType;
  not_null<const_slang::ast::Type_*> arrayType;
  Compilation *comp;
  Type *this_01;
  Diagnostic *this_02;
  Type *in_stack_ffffffffffffff48;
  BumpAllocator *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  DiagCode code;
  Args *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 isMethod;
  ASTContext *min;
  DiagCode code_00;
  QueueType *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  isMethod = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  min = in_RDI;
  this_00 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0x901b91);
  this_01 = (Type *)0x0;
  this_02 = (Diagnostic *)0x0;
  callRange.endLoc = in_R9;
  callRange.startLoc = this_00;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R8,in_RCX,(bool)isMethod,in_stack_ffffffffffffffa0,callRange,(size_t)min,
                     (size_t)in_RCX);
  code_00 = SUB84((ulong)in_RCX >> 0x20,0);
  if (bVar1) {
    if (in_R9 == (SourceLocation)0x0) {
      sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff64;
      sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff60;
      sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff68;
      sourceRange.endLoc._4_4_ = in_stack_ffffffffffffff6c;
      ASTContext::addDiag(in_RDI,code,sourceRange);
      Diagnostic::operator<<(this_02,(string *)this_01);
      local_8 = (QueueType *)Compilation::getErrorType((Compilation *)this_00);
    }
    else {
      bVar1 = ASTContext::requireBooleanConvertible((ASTContext *)in_R9,(Expression *)this_00);
      if (bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        if (((ulong)in_RDI[1].scope.ptr & 0x100000000) == 0) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x901e0c);
          Type::getArrayElementType((Type *)this_00);
          local_8 = BumpAllocator::
                    emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                              (in_stack_ffffffffffffff50,(Type *)this_00,(uint *)this_02);
        }
        else {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x901cf4);
          bVar1 = Type::isAssociativeArray((Type *)0x901cfc);
          if (bVar1) {
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0x901d0f);
            pTVar2 = Type::getAssociativeIndexType(this_01);
            if (pTVar2 == (Type *)0x0) {
              sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff64;
              sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff60;
              sourceRange_00.endLoc._0_4_ = in_stack_ffffffffffffff68;
              sourceRange_00.endLoc._4_4_ = in_stack_ffffffffffffff6c;
              ASTContext::addDiag(in_RDI,code_00,sourceRange_00);
              Diagnostic::operator<<(this_02,(string *)this_01);
              local_8 = (QueueType *)Compilation::getErrorType((Compilation *)this_00);
            }
            else {
              local_8 = BumpAllocator::
                        emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                   (uint *)this_02);
            }
          }
          else {
            Compilation::getIntType((Compilation *)this_00);
            local_8 = BumpAllocator::
                      emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                                ((BumpAllocator *)this_00,in_stack_ffffffffffffff48,(uint *)this_02)
            ;
          }
        }
      }
      else {
        local_8 = (QueueType *)Compilation::getErrorType((Compilation *)this_00);
      }
    }
  }
  else {
    local_8 = (QueueType *)Compilation::getErrorType((Compilation *)this_00);
  }
  return &local_8->super_Type;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!iterExpr) {
            context.addDiag(diag::ArrayLocatorWithClause, range) << name;
            return comp.getErrorType();
        }

        if (!context.requireBooleanConvertible(*iterExpr))
            return comp.getErrorType();

        auto arrayType = args[0]->type;
        if (isIndexed) {
            if (arrayType->isAssociativeArray()) {
                auto indexType = arrayType->getAssociativeIndexType();
                if (!indexType) {
                    context.addDiag(diag::AssociativeWildcardNotAllowed, range) << name;
                    return comp.getErrorType();
                }
                return *comp.emplace<QueueType>(*indexType, 0u);
            }
            return *comp.emplace<QueueType>(comp.getIntType(), 0u);
        }

        return *comp.emplace<QueueType>(*arrayType->getArrayElementType(), 0u);
    }